

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bridges_articulations.cpp
# Opt level: O3

int count_rec(int v,int skip)

{
  ulong *puVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  int *piVar7;
  
  uVar5 = (ulong)v;
  iVar6 = v + 0x3f;
  if (-1 < v) {
    iVar6 = v;
  }
  puVar1 = (ulong *)((long)(iVar6 >> 6) * 8 + (anonymous_namespace)::usedcnt + -8 +
                    (ulong)((uVar5 & 0x800000000000003f) < 0x8000000000000001) * 8);
  *puVar1 = *puVar1 | 1L << ((byte)v & 0x3f);
  piVar7 = edge.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar5].
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  piVar2 = edge.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar5].
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
  if (piVar7 == piVar2) {
    iVar6 = 1;
  }
  else {
    iVar6 = 1;
    do {
      iVar4 = *piVar7;
      if (iVar4 != skip) {
        iVar3 = iVar4 + 0x3f;
        if (-1 < iVar4) {
          iVar3 = iVar4;
        }
        if ((*(ulong *)((long)(iVar3 >> 6) * 8 + (anonymous_namespace)::usedcnt + -8 +
                       (ulong)(((long)iVar4 & 0x800000000000003fU) < 0x8000000000000001) * 8) >>
             ((long)iVar4 & 0x3fU) & 1) == 0) {
          iVar4 = count_rec(iVar4,skip);
          iVar6 = iVar6 + iVar4;
        }
      }
      piVar7 = piVar7 + 1;
    } while (piVar7 != piVar2);
  }
  return iVar6;
}

Assistant:

int count_rec(int v, int skip) {
    int cnt = 1;
    usedcnt[v] = true;

    for (int to : edge[v]) {
        if(to == skip || usedcnt[to]) 
            continue;

        cnt += count_rec(to, skip);
    }
    
    return cnt;
}